

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt8Isop(word *uOn,word *uOnDc,int nVars,word *uRes)

{
  int iVar1;
  word wVar2;
  ulong local_a8;
  word uRes2 [2];
  word uRes1 [2];
  word uRes0 [2];
  word uOnDc2 [2];
  word uOn2 [2];
  word uOn1 [2];
  word uOn0 [2];
  int local_2c;
  word *pwStack_28;
  int nCubes;
  word *uRes_local;
  word *pwStack_18;
  int nVars_local;
  word *uOnDc_local;
  word *uOn_local;
  
  local_2c = 0;
  pwStack_28 = uRes;
  uRes_local._4_4_ = nVars;
  pwStack_18 = uOnDc;
  uOnDc_local = uOn;
  if (nVars < 7) {
    wVar2 = Abc_Tt6Isop(*uOn,*uOnDc,nVars,&local_2c);
    pwStack_28[3] = wVar2;
    pwStack_28[2] = wVar2;
    pwStack_28[1] = wVar2;
    *pwStack_28 = wVar2;
  }
  else if ((nVars == 7) ||
          ((((*uOn == uOn[2] && (uOn[1] == uOn[3])) && (*uOnDc == uOnDc[2])) &&
           (uOnDc[1] == uOnDc[3])))) {
    local_2c = Abc_Tt7Isop(uOn,uOnDc,7,uRes);
    pwStack_28[2] = *pwStack_28;
    pwStack_28[3] = pwStack_28[1];
  }
  else {
    if (nVars != 8) {
      __assert_fail("nVars == 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x746,"int Abc_Tt8Isop(word *, word *, int, word *)");
    }
    uOn1[1] = *uOn & (uOnDc[2] ^ 0xffffffffffffffff);
    uOn2[1] = uOn[2] & (*uOnDc ^ 0xffffffffffffffff);
    uOn1[0] = uOn[3] & (uOnDc[1] ^ 0xffffffffffffffff);
    uRes0[1] = *uOnDc & uOnDc[2];
    uOnDc2[0] = uOnDc[1] & uOnDc[3];
    iVar1 = Abc_Tt7Isop(uOn1 + 1,uOnDc,7,uRes1 + 1);
    local_2c = iVar1 + local_2c;
    iVar1 = Abc_Tt7Isop(uOn2 + 1,pwStack_18 + 2,7,uRes2 + 1);
    local_2c = iVar1 + local_2c;
    uOnDc2[1] = *uOnDc_local & (uRes1[1] ^ 0xffffffffffffffff) |
                uOnDc_local[2] & (uRes2[1] ^ 0xffffffffffffffff);
    uOn2[0] = uOnDc_local[1] & (uRes0[0] ^ 0xffffffffffffffff) |
              uOnDc_local[3] & (uRes1[0] ^ 0xffffffffffffffff);
    iVar1 = Abc_Tt7Isop(uOnDc2 + 1,uRes0 + 1,7,&local_a8);
    local_2c = iVar1 + local_2c;
    *pwStack_28 = local_a8 | uRes1[1];
    pwStack_28[1] = uRes2[0] | uRes0[0];
    pwStack_28[2] = local_a8 | uRes2[1];
    pwStack_28[3] = uRes2[0] | uRes1[0];
    if ((((*uOnDc_local & (*pwStack_28 ^ 0xffffffffffffffff)) != 0) ||
        ((uOnDc_local[1] & (pwStack_28[1] ^ 0xffffffffffffffff)) != 0)) ||
       (((uOnDc_local[2] & (pwStack_28[2] ^ 0xffffffffffffffff)) != 0 ||
        ((uOnDc_local[3] & (pwStack_28[3] ^ 0xffffffffffffffff)) != 0)))) {
      __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x759,"int Abc_Tt8Isop(word *, word *, int, word *)");
    }
    if ((((*pwStack_28 & (*pwStack_18 ^ 0xffffffffffffffff)) != 0) ||
        ((pwStack_28[1] & (pwStack_18[1] ^ 0xffffffffffffffff)) != 0)) ||
       (((pwStack_28[2] & (pwStack_18[2] ^ 0xffffffffffffffff)) != 0 ||
        ((pwStack_28[3] & (pwStack_18[3] ^ 0xffffffffffffffff)) != 0)))) {
      __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x75a,"int Abc_Tt8Isop(word *, word *, int, word *)");
    }
  }
  return local_2c;
}

Assistant:

static inline int Abc_Tt8Isop( word uOn[4], word uOnDc[4], int nVars, word uRes[4] )
{
    int nCubes = 0;
    if ( nVars <= 6 )
        uRes[0] = uRes[1] = uRes[2] = uRes[3] = Abc_Tt6Isop( uOn[0], uOnDc[0], nVars, &nCubes );
    else if ( nVars == 7 || (uOn[0] == uOn[2] && uOn[1] == uOn[3] && uOnDc[0] == uOnDc[2] && uOnDc[1] == uOnDc[3]) )
    {
        nCubes = Abc_Tt7Isop( uOn, uOnDc, 7, uRes );
        uRes[2] = uRes[0];
        uRes[3] = uRes[1];
    }
    else 
    {
        word uOn0[2], uOn1[2], uOn2[2], uOnDc2[2], uRes0[2], uRes1[2], uRes2[2];
        assert( nVars == 8 );
        // cofactor
        uOn0[0] = uOn[0] & ~uOnDc[2];
        uOn0[1] = uOn[1] & ~uOnDc[3];
        uOn1[0] = uOn[2] & ~uOnDc[0];
        uOn1[1] = uOn[3] & ~uOnDc[1];
        uOnDc2[0] = uOnDc[0] & uOnDc[2];
        uOnDc2[1] = uOnDc[1] & uOnDc[3];
        // solve for cofactors
        nCubes += Abc_Tt7Isop( uOn0, uOnDc+0, 7, uRes0 );
        nCubes += Abc_Tt7Isop( uOn1, uOnDc+2, 7, uRes1 );
        uOn2[0] = (uOn[0] & ~uRes0[0]) | (uOn[2] & ~uRes1[0]);
        uOn2[1] = (uOn[1] & ~uRes0[1]) | (uOn[3] & ~uRes1[1]);
        nCubes += Abc_Tt7Isop( uOn2, uOnDc2, 7, uRes2 );
        // derive the final truth table
        uRes[0] = uRes2[0] | uRes0[0];
        uRes[1] = uRes2[1] | uRes0[1];
        uRes[2] = uRes2[0] | uRes1[0];
        uRes[3] = uRes2[1] | uRes1[1];
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0 );
    }
    return nCubes;
}